

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O0

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::PartialOccluderDiscardCullCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,PartialOccluderDiscardCullCase *this)

{
  ProgramSources local_e8;
  PartialOccluderDiscardCullCase *local_18;
  PartialOccluderDiscardCullCase *this_local;
  
  local_18 = this;
  this_local = (PartialOccluderDiscardCullCase *)__return_storage_ptr__;
  Utils::getGridDiscardShader(&local_e8,this->m_gridsize);
  Utils::quadWith(__return_storage_ptr__,&local_e8,0.2);
  glu::ProgramSources::~ProgramSources(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry				(void) const { return Utils::quadWith(Utils::getGridDiscardShader(m_gridsize), 0.2f); }